

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_array.c
# Opt level: O1

aspa_record * aspa_array_search(aspa_array *array,uint32_t customer_asn)

{
  uint uVar1;
  bool bVar2;
  aspa_record *paVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  
  if ((array->size == 0) || (array->capacity == 0)) {
LAB_00114275:
    paVar3 = (aspa_record *)0x0;
  }
  else {
    uVar6 = (ulong)(array->size - 1);
    uVar5 = 0;
    paVar3 = *(aspa_record **)(in_FS_OFFSET + 0x28);
    do {
      if (uVar6 < uVar5) goto LAB_00114275;
      uVar4 = uVar5 + uVar6 >> 1;
      uVar1 = array->data[uVar4].customer_asn;
      if (uVar1 == customer_asn) {
        paVar3 = array->data + uVar4;
LAB_00114249:
        bVar2 = false;
      }
      else if (uVar1 < customer_asn) {
        uVar5 = uVar4 + 1;
        bVar2 = true;
      }
      else {
        if (uVar5 + uVar6 < 2) {
          paVar3 = (aspa_record *)0x0;
          goto LAB_00114249;
        }
        uVar6 = uVar4 - 1;
        bVar2 = true;
      }
    } while (bVar2);
  }
  if (*(aspa_record **)(in_FS_OFFSET + 0x28) != *(aspa_record **)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return paVar3;
}

Assistant:

struct aspa_record *aspa_array_search(struct aspa_array *array, uint32_t customer_asn)
{
	// if the array is empty we return an error
	if (array->size == 0 || array->capacity == 0)
		return NULL;

	// left and right bound of our search space
	register size_t left = 0;
	register size_t right = array->size - 1;

	// we stop if right and left crossed
	while (left <= right) {
		// current center
		size_t center = (left + right) >> 1;
		uint32_t center_value = array->data[center].customer_asn;

		// success found the value
		if (center_value == customer_asn) {
			return &array->data[center];

			// value should be on the right side
		} else if (center_value < customer_asn) {
			left = center + 1;

			// value should be on the left side
		} else if (center == 0) {
			// value cannot be left of index 0
			return NULL;
		} else {
			right = center - 1;
		}
	}

	// element not found
	return NULL;
}